

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  string *psVar5;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  allocator<char> local_189;
  undefined1 local_188 [8];
  string val_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignorepatterns;
  allocator<char> local_131;
  undefined1 local_130 [8];
  string val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignorelist;
  undefined1 local_e0 [4];
  int optc;
  lddgraph lddg;
  char **argv_local;
  int argc_local;
  
  program_name = *argv;
  lddg._ignorepatterns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  if (argc < 2) {
    printhelp();
    exit(0);
  }
  lddgraph::lddgraph((lddgraph *)local_e0);
  while (iVar3 = getopt_long(argc,lddg._ignorepatterns.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             "b:vhi:I:e:f:g:tqV",longopts,0), pcVar1 = _optarg, iVar3 != -1) {
    switch(iVar3) {
    case 0x49:
      pvVar4 = lddgraph::getignorepatterns_abi_cxx11_((lddgraph *)local_e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&val_1.field_2 + 8),pvVar4);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_188,pcVar1,&local_189);
      std::allocator<char>::~allocator(&local_189);
      psVar5 = trim((string *)local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&val_1.field_2 + 8),psVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&val_1.field_2 + 8));
      lddgraph::setignorepatterns((lddgraph *)local_e0,&local_1a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1a8);
      std::__cxx11::string::~string((string *)local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&val_1.field_2 + 8));
      break;
    default:
      abort();
    case 0x56:
      lddgraph::setverbose((lddgraph *)local_e0,true);
      break;
    case 0x65:
      lddgraph::setimgmode((lddgraph *)local_e0,true);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,pcVar1,&local_1c9);
      lddgraph::setimgoutput((lddgraph *)local_e0,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator(&local_1c9);
      break;
    case 0x66:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar1,&local_1f1);
      lddgraph::setimgformat((lddgraph *)local_e0,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      break;
    case 0x67:
      lddgraph::setgvmode((lddgraph *)local_e0,true);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,pcVar1,&local_219);
      lddgraph::setgvoutput((lddgraph *)local_e0,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      break;
    case 0x68:
      printhelp();
      exit(0);
    case 0x69:
      pvVar4 = lddgraph::getignorelist_abi_cxx11_((lddgraph *)local_e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&val.field_2 + 8),pvVar4);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_130,pcVar1,&local_131);
      std::allocator<char>::~allocator(&local_131);
      psVar5 = trim((string *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&val.field_2 + 8),psVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ignorepatterns.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&val.field_2 + 8));
      lddgraph::setignorelist
                ((lddgraph *)local_e0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ignorepatterns.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ignorepatterns.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&val.field_2 + 8));
      break;
    case 0x71:
      lddgraph::setquiet((lddgraph *)local_e0,true);
      break;
    case 0x74:
      lddgraph::setuseldd((lddgraph *)local_e0,false);
      break;
    case 0x76:
      printversion();
      exit(0);
    }
  }
  pcVar1 = *(char **)(&(lddg._ignorepatterns.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                     (long)(argc + -1) * 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar1,&local_241);
  lddgraph::setinput((lddgraph *)local_e0,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  bVar2 = lddgraph::run((lddgraph *)local_e0);
  if (!bVar2) {
    exit(1);
  }
  exit(0);
}

Assistant:

int main(int argc, char* argv[])
{
  program_name = argv[0];

  /* Prints output when no arguments where specified */
  if (argc < 2)
  {
    printhelp();
    exit(EXIT_SUCCESS);
  }

  lddgraph lddg;

  int optc;
  while ((optc = getopt_long (argc, argv, "b:vhi:I:e:f:g:tqV", longopts, NULL)) != -1)
  {
    switch (optc)
    {
      case 'v':
      {
        printversion();
        exit(EXIT_SUCCESS);
      } break;
      case 'h':
      {
        printhelp();
        exit(EXIT_SUCCESS);
      } break;
      case 'i':
      {
        vector<string> ignorelist = lddg.getignorelist();
        string val = optarg;
        ignorelist.push_back(trim(val));
        lddg.setignorelist(ignorelist);
      } break;
      case 'I':
      {
        vector<string> ignorepatterns = lddg.getignorepatterns();
        string val = optarg;
        ignorepatterns.push_back(trim(val));
        lddg.setignorepatterns(ignorepatterns);
      } break;
      case 'e':
      {
        lddg.setimgmode(true);
        lddg.setimgoutput(optarg);
      } break;
      case 'f':
      {
        lddg.setimgformat(optarg);
      } break;
      case 'g':
      {
        lddg.setgvmode(true);
        lddg.setgvoutput(optarg);
      } break;
      case 't':
      {
        lddg.setuseldd(false);
      } break;
      case 'q':
      {
        lddg.setquiet(true);
      } break;
      case 'V':
      {
        lddg.setverbose(true);
      } break;
      default:
      {
        abort();
      } break;
    }
  }

  lddg.setinput(argv[argc - 1]);

  // Start the lddgraph processing
  if (lddg.run())
    exit(EXIT_SUCCESS);
  else
    exit(EXIT_FAILURE);
}